

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckNotNullUsage(Configuration *state,string *sql_statement,bool *print_statement)

{
  bool bVar1;
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  bVar1 = IsCreateStatement(sql_statement);
  if (bVar1) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,"(not null)",0x10);
    std::__cxx11::string::string((string *)&title,"NOT NULL Usage",&local_a9);
    std::__cxx11::string::string((string *)&local_48,(string *)&title);
    std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_69e43,&local_a9);
    CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_NONE,PATTERN_TYPE_QUERY,
                 &local_48,&local_68,true,0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  }
  return;
}

Assistant:

void CheckNotNullUsage(Configuration& state,
                       const std::string& sql_statement,
                       bool& print_statement) {

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::regex pattern("(not null)");
  std::string title = "NOT NULL Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Use NOT NULL only if the column cannot have a missing value:  "
      "When you declare a column as NOT NULL, it should be because it would make no sense "
      "for the row to exist without a value in that column. "
      "Use null to signify a missing value for any data type.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_NONE,
               pattern_type,
               title,
               message,
               true);

}